

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChAparticle::ArchiveOUT(ChAparticle *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::collision::ChCollisionModel_*> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChAparticle>(marchive);
  ChFrameMoving<double>::ArchiveOUT((ChFrameMoving<double> *)this,marchive);
  local_30._value = &this->collision_model;
  local_30._name = "collision_model";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->UserForce;
  local_48._name = "UserForce";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->UserTorque;
  local_60._name = "UserTorque";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChAparticle::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChAparticle>();

    // serialize parent class
    ChParticleBase::ArchiveOUT(marchive);

    // serialize all member data:
    // marchive << CHNVP(container);
    marchive << CHNVP(collision_model);
    marchive << CHNVP(UserForce);
    marchive << CHNVP(UserTorque);
}